

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

TPZManVector<float,_3> * __thiscall
TPZManVector<float,_3>::operator=(TPZManVector<float,_3> *this,TPZManVector<float,_3> *copy)

{
  ulong uVar1;
  float *pfVar2;
  long lVar3;
  float *pfVar4;
  ulong uVar5;
  
  if (this != copy) {
    uVar1 = (copy->super_TPZVec<float>).fNElements;
    lVar3 = (this->super_TPZVec<float>).fNAlloc;
    if ((lVar3 < (long)uVar1) &&
       (pfVar4 = (this->super_TPZVec<float>).fStore,
       pfVar4 != this->fExtAlloc && pfVar4 != (float *)0x0)) {
      operator_delete__(pfVar4);
      lVar3 = 0;
      (this->super_TPZVec<float>).fStore = (float *)0x0;
      (this->super_TPZVec<float>).fNAlloc = 0;
    }
    if ((long)uVar1 < 4) {
      pfVar4 = (this->super_TPZVec<float>).fStore;
      if (pfVar4 != (float *)0x0 && pfVar4 != this->fExtAlloc) {
        operator_delete__(pfVar4);
      }
      (this->super_TPZVec<float>).fNAlloc = 0;
      (this->super_TPZVec<float>).fStore = this->fExtAlloc;
      (this->super_TPZVec<float>).fNElements = uVar1;
      if ((long)uVar1 < 1) {
        return this;
      }
    }
    else {
      if (lVar3 < (long)uVar1) {
        pfVar4 = (float *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
        (this->super_TPZVec<float>).fStore = pfVar4;
        (this->super_TPZVec<float>).fNAlloc = uVar1;
      }
      (this->super_TPZVec<float>).fNElements = uVar1;
    }
    pfVar4 = (copy->super_TPZVec<float>).fStore;
    pfVar2 = (this->super_TPZVec<float>).fStore;
    uVar5 = 0;
    do {
      pfVar2[uVar5] = pfVar4[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}